

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O0

void ps_hints_t1reset(PS_Hints hints,FT_UInt end_point)

{
  FT_Memory memory_00;
  FT_Memory memory;
  FT_Error error;
  FT_UInt end_point_local;
  PS_Hints hints_local;
  
  if (hints->error == 0) {
    memory_00 = hints->memory;
    if (hints->hint_type == PS_HINT_TYPE_1) {
      memory._0_4_ = ps_dimension_reset_mask(hints->dimension,end_point,memory_00);
      if (((FT_Error)memory == 0) &&
         (memory._0_4_ = ps_dimension_reset_mask(hints->dimension + 1,end_point,memory_00),
         (FT_Error)memory == 0)) {
        return;
      }
    }
    else {
      memory._0_4_ = 6;
    }
    hints->error = (FT_Error)memory;
  }
  return;
}

Assistant:

static void
  ps_hints_t1reset( PS_Hints  hints,
                    FT_UInt   end_point )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !hints->error )
    {
      FT_Memory  memory = hints->memory;


      if ( hints->hint_type == PS_HINT_TYPE_1 )
      {
        error = ps_dimension_reset_mask( &hints->dimension[0],
                                         end_point, memory );
        if ( error )
          goto Fail;

        error = ps_dimension_reset_mask( &hints->dimension[1],
                                         end_point, memory );
        if ( error )
          goto Fail;
      }
      else
      {
        /* invalid hint type */
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }
    }
    return;

  Fail:
    hints->error = error;
  }